

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::iterate(ReadPixelsTest *this)

{
  GLint *data;
  FramebufferType width;
  RenderContext *renderCtx;
  float fVar1;
  ReadPixelsTest *pRVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  GLenum GVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint index;
  FramebufferType FVar8;
  ChannelOrder CVar9;
  ChannelType CVar10;
  char *pcVar11;
  pointer __dest;
  RenderTarget *pRVar12;
  TestError *this_00;
  byte bVar13;
  byte bVar14;
  long lVar15;
  int y;
  int y_00;
  int iVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  GLuint renderbuffer;
  GLuint framebuffer;
  Random rnd;
  TextureFormat format;
  IVec4 formatBitDepths;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelData;
  size_type __dnew;
  Texture2D reference;
  GLfloat color [4];
  stringstream fragmentSource;
  ConstPixelBufferAccess resultAccess;
  GLuint local_448;
  GLfloat local_444;
  GLuint local_440;
  float local_43c;
  deRandom local_438;
  TextureFormat local_428;
  ReadPixelsTest *local_420;
  value_type local_418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f8;
  value_type local_3d8;
  undefined1 local_3b8 [80];
  undefined1 local_368 [8];
  float local_360;
  float local_35c;
  ConstPixelBufferAccess *local_348;
  GLuint local_2d0;
  bool local_2a8;
  undefined1 local_290 [8];
  float local_288;
  float local_284;
  undefined1 local_280 [104];
  ios_base local_218 [8];
  ios_base local_210 [264];
  ProgramSources local_108;
  
  local_428.order = RGBA;
  local_428.type = UNORM_INT8;
  if ((char)(this->m_random).m_rnd.y == '\x01') {
    glwGetIntegerv(0x8b9b,(GLint *)&this->m_program);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_FORMAT, &m_format)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xd0);
    data = (GLint *)((long)&this->m_program + 4);
    glwGetIntegerv(0x8b9a,data);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_TYPE, &m_type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xd1);
    if ((1 < *(int *)&this->m_program - 0x1907U) && (*(int *)&this->m_program != 0x80e1)) {
      auVar19 = __cxa_allocate_exception(0x38);
      local_108.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)glu::getTextureFormatName;
      local_108.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_108.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             *(undefined4 *)&this->m_program);
      de::toString<tcu::Format::Enum<int,2ul>>((string *)local_368,(de *)&local_108,auVar19._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                     "Unsupported IMPLEMENTATION_COLOR_READ_FORMAT: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368)
      ;
      tcu::NotSupportedError::NotSupportedError
                (auVar19._0_8_,(char *)local_290,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                 ,0xd4);
      __cxa_throw(auVar19._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar11 = glu::getTypeName(*data);
    if (pcVar11 == (char *)0x0) {
      auVar19 = __cxa_allocate_exception(0x38);
      local_108.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)*data;
      de::toString<tcu::Format::Hex<4ul>>((string *)local_368,(de *)&local_108,auVar19._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                     "Unsupported GL_IMPLEMENTATION_COLOR_READ_TYPE: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368)
      ;
      tcu::NotSupportedError::NotSupportedError
                (auVar19._0_8_,(char *)local_290,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                 ,0xd6);
      __cxa_throw(auVar19._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_428 = glu::mapGLTransferFormat
                        (*(deUint32 *)&this->m_program,*(deUint32 *)((long)&this->m_program + 4));
  iVar6 = tcu::TextureFormat::getPixelSize(&local_428);
  local_290 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,"Format: ",8);
  local_360 = *(float *)&this->m_program;
  local_368 = (undefined1  [8])glu::getTextureFormatName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_368,(ostream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", Type: ",8);
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)glu::getTypeName;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_108.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         *(undefined4 *)((long)&this->m_program + 4));
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_108,(ostream *)&local_288);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  std::ios_base::~ios_base(local_218);
  tcu::Texture2D::Texture2D
            ((Texture2D *)local_3b8,&local_428,this->m_framebuffeType,this->m_renderbufferFormat);
  tcu::Texture2D::allocLevel((Texture2D *)local_3b8,0);
  glwPixelStorei(0xd05,(this->m_random).m_rnd.z);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glPixelStorei(GL_PACK_ALIGNMENT, m_alignment)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x152);
  local_290 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"GL_PACK_ALIGNMENT: ",0x13);
  std::ostream::operator<<((ostringstream *)&local_288,(this->m_random).m_rnd.z);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  std::ios_base::~ios_base(local_218);
  glwPixelStorei(0xd02,(this->m_random).m_rnd.w);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glPixelStorei(GL_PACK_ROW_LENGTH, m_rowLength)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x155);
  local_290 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"GL_PACK_ROW_LENGTH: ",0x14);
  std::ostream::operator<<((ostringstream *)&local_288,(this->m_random).m_rnd.w);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  std::ios_base::~ios_base(local_218);
  glwPixelStorei(0xd03,*(GLint *)&this->m_log);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glPixelStorei(GL_PACK_SKIP_ROWS, m_skipRows)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x158);
  local_290 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"GL_PACK_SKIP_ROWS: ",0x13);
  std::ostream::operator<<((ostringstream *)&local_288,*(int *)&this->m_log);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  std::ios_base::~ios_base(local_218);
  glwPixelStorei(0xd04,*(GLint *)((long)&this->m_log + 4));
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glPixelStorei(GL_PACK_SKIP_PIXELS, m_skipPixels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x15b);
  local_290 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"GL_PACK_SKIP_PIXELS: ",0x15);
  std::ostream::operator<<((ostringstream *)&local_288,*(int *)((long)&this->m_log + 4));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  std::ios_base::~ios_base(local_218);
  glwViewport(0,0,this->m_framebuffeType,this->m_renderbufferFormat);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glViewport(0, 0, m_width, m_height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x15e);
  local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_438,(this->m_random).m_rnd.x);
  local_440 = 0;
  local_448 = 0;
  if (*(char *)((long)&(this->m_random).m_rnd.y + 1) == '\x01') {
    iVar16 = *(int *)((long)&this->m_program + 4);
    if (iVar16 == 0x1404) {
      glwGenRenderbuffers(1,&local_448);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glGenRenderbuffers(1, &renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xed);
      glwBindRenderbuffer(0x8d41,local_448);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xee);
      glwRenderbufferStorage(0x8d41,0x8d82,this->m_framebuffeType,this->m_renderbufferFormat);
      dVar7 = glwGetError();
      iVar16 = 0xef;
      pcVar11 = "glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32I, m_width, m_height)";
LAB_0123056b:
      glu::checkError(dVar7,pcVar11,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,iVar16);
    }
    else if (iVar16 == 0x1405) {
      glwGenRenderbuffers(1,&local_448);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glGenRenderbuffers(1, &renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xe7);
      glwBindRenderbuffer(0x8d41,local_448);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xe8);
      glwRenderbufferStorage(0x8d41,0x8d70,this->m_framebuffeType,this->m_renderbufferFormat);
      dVar7 = glwGetError();
      iVar16 = 0xe9;
      pcVar11 = "glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32UI, m_width, m_height)";
      goto LAB_0123056b;
    }
    glwBindRenderbuffer(0x8d41,0);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindRenderbuffer(GL_RENDERBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf4);
    glwGenFramebuffers(1,&local_440);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenFramebuffers(1, &framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf5);
    glwBindFramebuffer(0x8d40,local_440);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindFramebuffer(GL_FRAMEBUFFER, framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf6);
    glwFramebufferRenderbuffer(0x8d40,0x8ce0,0x8d41,local_448);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf7);
  }
  glwViewport(0,0,local_3b8._56_4_,local_3b8._60_4_);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glViewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x100);
  iVar16 = *(int *)&this->m_program;
  local_420 = this;
  if (iVar16 - 0x1907U < 2) {
LAB_01230698:
    fVar17 = deRandom_getFloat(&local_438);
    fVar18 = deRandom_getFloat(&local_438);
    local_444 = deRandom_getFloat(&local_438);
    local_43c = deRandom_getFloat(&local_438);
    local_368._4_4_ = fVar18;
    local_368._0_4_ = fVar17;
    local_360 = local_444;
    local_35c = local_43c;
    glwClearColor(fVar17,fVar18,local_444,local_43c);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glClearColor(red, green, blue, alpha)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x10c);
    local_290 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,"ClearColor: (",0xd);
    std::ostream::_M_insert<double>((double)fVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", ",2);
    std::ostream::_M_insert<double>((double)fVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", ",2);
    std::ostream::_M_insert<double>((double)local_444);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
    std::ios_base::~ios_base(local_218);
    glwClearBufferfv(0x1800,0,(GLfloat *)local_368);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glClearBufferfv(GL_COLOR, 0, color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x10f);
    local_290._4_4_ = fVar18;
    local_290._0_4_ = fVar17;
    local_288 = local_444;
    local_284 = local_43c;
    tcu::clear((PixelBufferAccess *)local_3b8._32_8_,(Vec4 *)local_290);
  }
  else if (iVar16 == 0x8d99) {
    iVar16 = *(int *)((long)&this->m_program + 4);
    if (iVar16 == 0x1405) {
      CVar9 = deRandom_getUint32(&local_438);
      CVar10 = deRandom_getUint32(&local_438);
      fVar17 = (float)deRandom_getUint32(&local_438);
      fVar18 = (float)deRandom_getUint32(&local_438);
      local_368._4_4_ = CVar10;
      local_368._0_4_ = CVar9;
      local_290 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_360 = fVar17;
      local_35c = fVar18;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,"ClearColor: (",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
      std::ios_base::~ios_base(local_218);
      glwClearBufferuiv(0x1800,0,(GLuint *)local_368);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glClearBufferuiv(GL_COLOR, 0, color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0x12d);
      local_290._4_4_ = CVar10;
      local_290._0_4_ = CVar9;
      local_288 = fVar17;
      local_284 = fVar18;
      tcu::clear((PixelBufferAccess *)local_3b8._32_8_,(UVec4 *)local_290);
      this = local_420;
    }
    else if (iVar16 == 0x1404) {
      CVar9 = deRandom_getUint32(&local_438);
      CVar10 = deRandom_getUint32(&local_438);
      fVar17 = (float)deRandom_getUint32(&local_438);
      fVar18 = (float)deRandom_getUint32(&local_438);
      local_368._4_4_ = CVar10;
      local_368._0_4_ = CVar9;
      local_290 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_360 = fVar17;
      local_35c = fVar18;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,"ClearColor: (",0xd);
      std::ostream::operator<<((ostringstream *)&local_288,CVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", ",2);
      std::ostream::operator<<((ostringstream *)&local_288,CVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,", ",2);
      std::ostream::operator<<((ostringstream *)&local_288,(int)fVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
      std::ios_base::~ios_base(local_218);
      glwClearBufferiv(0x1800,0,(GLint *)local_368);
      GVar5 = glwGetError();
      glu::checkError(GVar5,"glClearBufferiv(GL_COLOR, 0, color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0x11f);
      local_290._4_4_ = CVar10;
      local_290._0_4_ = CVar9;
      local_288 = fVar17;
      local_284 = fVar18;
      tcu::clear((PixelBufferAccess *)local_3b8._32_8_,(IVec4 *)local_290);
      this = local_420;
    }
  }
  else if (iVar16 == 0x80e1) goto LAB_01230698;
  std::__cxx11::stringstream::stringstream((stringstream *)local_290);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"#version 300 es\n",0x10);
  lVar15 = 0x30;
  if (local_3b8._4_4_ == UNSIGNED_INT32) {
    pcVar11 = "layout(location = 0) out mediump uvec4 o_color;\n";
  }
  else if (local_3b8._4_4_ == SIGNED_INT32) {
    pcVar11 = "layout(location = 0) out mediump ivec4 o_color;\n";
  }
  else {
    lVar15 = 0x2f;
    pcVar11 = "layout(location = 0) out mediump vec4 o_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar11,lVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"void main (void)\n{\n",0x13);
  if (local_3b8._4_4_ == UNSIGNED_INT32) {
    pcVar11 = "\to_color = uvec4(0, 0, 0, 1000);\n";
    lVar15 = 0x21;
  }
  else if (local_3b8._4_4_ == SIGNED_INT32) {
    lVar15 = 0x21;
    pcVar11 = "\to_color = ivec4(0, 0, 0, 1000);\n";
  }
  else {
    lVar15 = 0x25;
    pcVar11 = "\to_color = vec4(0.0, 0.0, 0.0, 1.0);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar11,lVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3d8._M_dataplus._M_p = (pointer)0x66;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&local_3d8);
  _Var3._M_p = local_3d8._M_dataplus._M_p;
  local_418.field_2._M_allocated_capacity = (size_type)local_3d8._M_dataplus._M_p;
  local_418._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 300 es\nin mediump vec2 i_coord;\nvoid main (void)\n{\n\tgl_Position = vec4(i_coord, 0.0, 1.0);\n}\n"
         ,0x66);
  local_418._M_string_length = (size_type)_Var3._M_p;
  __dest[_Var3._M_p] = '\0';
  std::__cxx11::stringbuf::str();
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_108._193_8_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_108,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources,&local_418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources + 1,&local_3d8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_368,renderCtx,&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_108.attribLocationBindings);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_108.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,(ulong)(local_418.field_2._M_allocated_capacity + 1))
    ;
  }
  glu::operator<<(((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_368);
  if (local_2a8 == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
               ,0x95);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glwUseProgram(local_2d0);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glUseProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x96);
  local_108.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f000000bf000000;
  local_108.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xbf000000bf000000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_3f0000003f000000;
  local_108.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3f0000003f000000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf000000bf000000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbf0000003f000000;
  index = glwGetAttribLocation(local_2d0,"i_coord");
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0xa7);
  glwEnableVertexAttribArray(index);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glEnableVertexAttribArray(coordLoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0xa9);
  glwVertexAttribPointer(index,2,0x1406,'\0',0,&local_108);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0xab);
  glwDrawArrays(4,0,6);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glDrawArrays(GL_TRIANGLES, 0, 6)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0xad);
  glwDisableVertexAttribArray(index);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glDisableVertexAttribArray(coordLoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0xae);
  if (0 < (int)local_3b8._56_4_) {
    fVar17 = (float)(int)local_3b8._56_4_ * 0.5;
    fVar18 = (float)(int)local_3b8._60_4_ * 0.5;
    iVar16 = 0;
    do {
      if ((((int)(fVar17 - fVar17 * 0.5) <= iVar16) && (iVar16 <= (int)(fVar17 * 0.5 + fVar17))) &&
         (0 < (int)local_3b8._60_4_)) {
        y_00 = 0;
        do {
          if (((int)(fVar18 - fVar18 * 0.5) <= y_00) && (y_00 <= (int)(fVar18 * 0.5 + fVar18))) {
            if (local_3b8._4_4_ == UNSIGNED_INT32) {
              local_108.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_108.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e800000000;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_3b8._32_8_,(IVec4 *)&local_108,iVar16,y_00,0);
            }
            else if (local_3b8._4_4_ == SIGNED_INT32) {
              local_108.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_108.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e800000000;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_3b8._32_8_,(IVec4 *)&local_108,iVar16,y_00,0);
            }
            else {
              local_108.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0;
              local_108.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_3b8._32_8_,(Vec4 *)&local_108,iVar16,y_00,0);
            }
          }
          y_00 = y_00 + 1;
        } while (y_00 < (int)local_3b8._60_4_);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_3b8._56_4_);
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_368);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_290);
  std::ios_base::~ios_base(local_210);
  pRVar2 = local_420;
  dVar7 = (local_420->m_random).m_rnd.z;
  FVar8 = (local_420->m_random).m_rnd.w;
  if (FVar8 == FRAMEBUFFERTYPE_NATIVE) {
    FVar8 = local_420->m_framebuffeType;
  }
  fVar17 = ceilf((float)(int)((FVar8 + *(int *)((long)&local_420->m_log + 4)) * iVar6) /
                 (float)(int)dVar7);
  local_290 = (undefined1  [8])((ulong)local_290 & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_3f8,
             (long)(int)((*(int *)&pRVar2->m_log + pRVar2->m_renderbufferFormat) * dVar7 *
                        (int)fVar17),local_290);
  glwReadPixels(0,0,pRVar2->m_framebuffeType,pRVar2->m_renderbufferFormat,
                *(GLenum *)&pRVar2->m_program,*(GLenum *)((long)&pRVar2->m_program + 4),
                local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glReadPixels(0, 0, m_width, m_height, m_format, m_type, &(pixelData[0]))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x13e);
  if (local_440 != 0) {
    glwDeleteFramebuffers(1,&local_440);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glDeleteFramebuffers(1, &framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x141);
  }
  if (local_448 != 0) {
    glwDeleteRenderbuffers(1,&local_448);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glDeleteRenderbuffers(1, &renderbuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x144);
  }
  dVar7 = (pRVar2->m_random).m_rnd.z;
  FVar8 = (pRVar2->m_random).m_rnd.w;
  width = pRVar2->m_framebuffeType;
  if (FVar8 == FRAMEBUFFERTYPE_NATIVE) {
    FVar8 = width;
  }
  fVar17 = ceilf((float)(int)(FVar8 * iVar6) / (float)(int)dVar7);
  iVar16 = (int)fVar17 * dVar7;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&local_108,&local_428,width,pRVar2->m_renderbufferFormat,1,
             iVar16,0,local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (*(int *)&pRVar2->m_log * iVar16 + *(int *)((long)&pRVar2->m_log + 4) * iVar6)
            );
  if (*(char *)((long)&(pRVar2->m_random).m_rnd.y + 1) == '\0') {
    pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
    if (1 < pRVar12->m_numSamples) {
      tcu::getTextureFormatBitDepth((tcu *)&local_418,&local_428);
      pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
      iVar6 = (pRVar12->m_pixelFormat).redBits;
      iVar16 = (int)local_418._M_dataplus._M_p;
      if (iVar6 < (int)local_418._M_dataplus._M_p) {
        iVar16 = iVar6;
      }
      fVar17 = ceilf((2.0 / (float)(1 << ((byte)iVar16 & 0x1f))) * 256.0);
      pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
      iVar6 = (pRVar12->m_pixelFormat).greenBits;
      bVar13 = (byte)((ulong)local_418._M_dataplus._M_p >> 0x20);
      if (iVar6 < local_418._M_dataplus._M_p._4_4_) {
        bVar13 = (byte)iVar6;
      }
      fVar18 = ceilf((2.0 / (float)(1 << (bVar13 & 0x1f))) * 256.0);
      pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
      iVar6 = (pRVar12->m_pixelFormat).blueBits;
      iVar16 = (int)local_418._M_string_length;
      if (iVar6 < (int)local_418._M_string_length) {
        iVar16 = iVar6;
      }
      local_444 = ceilf((2.0 / (float)(1 << ((byte)iVar16 & 0x1f))) * 256.0);
      pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
      iVar6 = (pRVar12->m_pixelFormat).alphaBits;
      bVar13 = (byte)(local_418._M_string_length >> 0x20);
      if (iVar6 < local_418._M_string_length._4_4_) {
        bVar13 = (byte)iVar6;
      }
      local_43c = ceilf((2.0 / (float)(1 << (bVar13 & 0x1f))) * 256.0);
      local_368._0_4_ = RGBA;
      local_368._4_4_ = UNORM_INT8;
      tcu::Texture2D::Texture2D
                ((Texture2D *)local_290,(TextureFormat *)local_368,pRVar2->m_framebuffeType,
                 pRVar2->m_renderbufferFormat);
      local_3d8._M_dataplus._M_p = (pointer)0x300000008;
      tcu::Texture2D::Texture2D
                ((Texture2D *)local_368,(TextureFormat *)&local_3d8,pRVar2->m_framebuffeType,
                 pRVar2->m_renderbufferFormat);
      tcu::Texture2D::allocLevel((Texture2D *)local_290,0);
      tcu::Texture2D::allocLevel((Texture2D *)local_368,0);
      tcu::copy((EVP_PKEY_CTX *)local_280._16_8_,(EVP_PKEY_CTX *)local_3b8._32_8_);
      tcu::copy((EVP_PKEY_CTX *)local_348,(EVP_PKEY_CTX *)&local_108);
      bVar4 = tcu::bilinearCompare
                        (((pRVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         "Result","Result",(ConstPixelBufferAccess *)local_280._16_8_,local_348,
                         (RGBA)(((int)local_444 & 0xffU) << 0x10 |
                                ((int)fVar18 & 0xffU) << 8 | (int)fVar17 & 0xffU |
                               (int)local_43c << 0x18),COMPARE_LOG_RESULT);
      pcVar11 = "Fail";
      if (bVar4) {
        pcVar11 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((pRVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,
                 pcVar11);
      tcu::Texture3D::~Texture3D((Texture3D *)local_368);
      tcu::Texture3D::~Texture3D((Texture3D *)local_290);
      goto LAB_01231300;
    }
  }
  tcu::getTextureFormatBitDepth((tcu *)local_290,&local_428);
  pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
  fVar17 = (float)(pRVar12->m_pixelFormat).redBits;
  fVar18 = (float)local_290._0_4_;
  if ((int)fVar17 < (int)local_290._0_4_) {
    fVar18 = fVar17;
  }
  pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
  iVar6 = (pRVar12->m_pixelFormat).greenBits;
  bVar13 = local_290[4];
  if (iVar6 < (int)local_290._4_4_) {
    bVar13 = (byte)iVar6;
  }
  pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
  fVar1 = local_288;
  fVar17 = (float)(pRVar12->m_pixelFormat).blueBits;
  pRVar12 = Context::getRenderTarget((pRVar2->super_TestCase).m_context);
  if ((int)fVar17 < (int)fVar1) {
    fVar1 = fVar17;
  }
  local_360 = 2.0 / (float)(1 << (SUB41(fVar1,0) & 0x1f));
  iVar6 = (pRVar12->m_pixelFormat).alphaBits;
  bVar14 = SUB41(local_284,0);
  if (iVar6 < (int)local_284) {
    bVar14 = (byte)iVar6;
  }
  local_35c = 2.0 / (float)(1 << (bVar14 & 0x1f));
  local_368._4_4_ = 2.0 / (float)(1 << (bVar13 & 0x1f));
  local_368._0_4_ = 2.0 / (float)(1 << (SUB41(fVar18,0) & 0x1f));
  bVar4 = tcu::floatThresholdCompare
                    (((pRVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "Result","Result",(ConstPixelBufferAccess *)local_3b8._32_8_,
                     (ConstPixelBufferAccess *)&local_108,(Vec4 *)local_368,COMPARE_LOG_RESULT);
  pcVar11 = "Fail";
  if (bVar4) {
    pcVar11 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pRVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,pcVar11);
LAB_01231300:
  if (local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)local_3b8);
  return STOP;
}

Assistant:

TestCase::IterateResult ReadPixelsTest::iterate(void)
{
	int width				= m_context.getRenderTarget().getWidth();
	int height				= m_context.getRenderTarget().getHeight();

	GLuint framebuffer	= 0;
	GLuint renderbuffer	= 0;

	switch (m_framebuffeType)
	{
		case TestSpec::FRAMEBUFFERTYPE_NATIVE:
			GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, framebuffer));
			break;

		case TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER:
		{
			GLU_CHECK_CALL(glGenFramebuffers(1, &framebuffer));
			GLU_CHECK_CALL(glGenRenderbuffers(1, &renderbuffer));

			GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer));
			GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, m_renderbufferFormat, width, height));

			GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, framebuffer));
			GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer));

			break;
		}

		default:
			DE_ASSERT(false);
	}

	clearColor(m_colorScale * 0.4f, m_colorScale * 1.0f, m_colorScale * 0.5f, m_colorScale * 1.0f);

	if (m_useColorClears)
	{
		const int maxClearCount	= 10;
		const int minClearCount	= 6;
		const int minClearSize	= 15;

		int clearCount = m_random.getInt(minClearCount, maxClearCount);

		for (int clearNdx = 0; clearNdx < clearCount; clearNdx++)
		{
			int clearX = m_random.getInt(0, width - minClearSize);
			int clearY = m_random.getInt(0, height - minClearSize);

			int clearWidth = m_random.getInt(minClearSize, width - clearX);
			int clearHeight = m_random.getInt(minClearSize, height - clearY);

			float clearRed		= m_colorScale * m_random.getFloat();
			float clearGreen	= m_colorScale * m_random.getFloat();
			float clearBlue		= m_colorScale * m_random.getFloat();
			float clearAlpha	= m_colorScale * (0.5f + 0.5f * m_random.getFloat());

			GLU_CHECK_CALL(glEnable(GL_SCISSOR_TEST));
			GLU_CHECK_CALL(glScissor(clearX, clearY, clearWidth, clearHeight));

			clearColor(clearRed, clearGreen, clearBlue, clearAlpha);
		}

		GLU_CHECK_CALL(glDisable(GL_SCISSOR_TEST));
	}

	if (m_renderTriangles)
	{
		const int minTriangleCount = 4;
		const int maxTriangleCount = 10;

		int triangleCount = m_random.getInt(minTriangleCount, maxTriangleCount);

		for (int triangleNdx = 0; triangleNdx < triangleCount; triangleNdx++)
		{
			float x1 = 2.0f * m_random.getFloat() - 1.0f;
			float y1 = 2.0f * m_random.getFloat() - 1.0f;
			float z1 = 2.0f * m_random.getFloat() - 1.0f;

			float x2 = 2.0f * m_random.getFloat() - 1.0f;
			float y2 = 2.0f * m_random.getFloat() - 1.0f;
			float z2 = 2.0f * m_random.getFloat() - 1.0f;

			float x3 = 2.0f * m_random.getFloat() - 1.0f;
			float y3 = 2.0f * m_random.getFloat() - 1.0f;
			float z3 = 2.0f * m_random.getFloat() - 1.0f;

			renderTriangle(tcu::Vec3(x1, y1, z1), tcu::Vec3(x2, y2, z2), tcu::Vec3(x3, y3, z3));
		}
	}

	tcu::TextureFormat	readFormat;
	GLenum				readPixelsFormat;
	GLenum				readPixelsType;
	bool				floatCompare;


	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
		readPixelsFormat	= GL_RGBA;
		readPixelsType		= GL_UNSIGNED_BYTE;
		floatCompare		= false;
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_UNSIGNED_BYTE;
				floatCompare		= true;
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA_INTEGER, GL_INT);
				readPixelsFormat	= GL_RGBA_INTEGER;
				readPixelsType		= GL_INT;
				floatCompare		= false;
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA_INTEGER, GL_UNSIGNED_INT);
				readPixelsFormat	= GL_RGBA_INTEGER;
				readPixelsType		= GL_UNSIGNED_INT;
				floatCompare		= false;
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_FLOAT;
				floatCompare		= true;
				break;

			default:
				DE_ASSERT(false);
				// Silence warnings
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_FLOAT;
				floatCompare		= true;
		}
	}
	else
	{
		// Silence warnings
		readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
		readPixelsFormat	= GL_RGBA;
		readPixelsType		= GL_FLOAT;
		floatCompare		= true;
		DE_ASSERT(false);
	}

	tcu::Texture2D	readRefrence	(readFormat, width, height);
	const int		readDataSize	= readRefrence.getWidth() * readRefrence.getHeight() * readFormat.getPixelSize();

	readRefrence.allocLevel(0);

	GLuint pixelBuffer = (GLuint)-1;

	GLU_CHECK_CALL(glGenBuffers(1, &pixelBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, pixelBuffer));
	GLU_CHECK_CALL(glBufferData(GL_PIXEL_PACK_BUFFER, readDataSize, NULL, GL_STREAM_READ));

	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, readPixelsFormat, readPixelsType, 0));

	const deUint8* bufferData = (const deUint8*)glMapBufferRange(GL_PIXEL_PACK_BUFFER, 0, readDataSize, GL_MAP_READ_BIT);
	GLU_CHECK_MSG("glMapBufferRange() failed");

	tcu::ConstPixelBufferAccess readResult(readFormat, width, height, 1, bufferData);

	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, 0));

	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, readPixelsFormat, readPixelsType, readRefrence.getLevel(0).getDataPtr()));

	if (framebuffer)
		GLU_CHECK_CALL(glDeleteFramebuffers(1, &framebuffer));

	if (renderbuffer)
		GLU_CHECK_CALL(glDeleteRenderbuffers(1, &renderbuffer));


	bool isOk = false;

	if (floatCompare)
		isOk = tcu::floatThresholdCompare(m_log, "Result comparision", "Result of read pixels to memory compared with result of read pixels to buffer", readRefrence.getLevel(0), readResult, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::COMPARE_LOG_RESULT);
	else
		isOk = tcu::intThresholdCompare(m_log, "Result comparision", "Result of read pixels to memory compared with result of read pixels to buffer", readRefrence.getLevel(0), readResult, tcu::UVec4(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, pixelBuffer));
	GLU_CHECK_CALL(glUnmapBuffer(GL_PIXEL_PACK_BUFFER));
	GLU_CHECK_CALL(glDeleteBuffers(1, &pixelBuffer));

	if (isOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}
}